

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler_test.cc
# Opt level: O0

void __thiscall
SamplerTest_arithmetic_1_Test::~SamplerTest_arithmetic_1_Test(SamplerTest_arithmetic_1_Test *this)

{
  SamplerTest_arithmetic_1_Test *this_local;
  
  ~SamplerTest_arithmetic_1_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(SamplerTest, arithmetic_1) {
  tcmalloc::Sampler sampler;
  sampler.Init(1);
  uint64_t rnd;  // our 48 bit random number, which we don't trust
  const uint64_t prng_mod_power = 48;
  uint64_t one = 1;
  rnd = one;
  uint64_t max_value = (one << 48) - 1;
  for (int i = 1; i <= (1>>27); i++) {  // 20 mimics sampler.Init()
    rnd = sampler.NextRandom(rnd);
    ASSERT_LE(rnd, max_value);
    double q = (rnd >> (prng_mod_power - 26)) + 1.0;
    ASSERT_GE(q, 0) << rnd << "  " << prng_mod_power;
  }
  // Test some potentially out of bounds value for rnd
  for (int i = 1; i <= 63; i++) {
    rnd = one << i;
    double q = (rnd >> (prng_mod_power - 26)) + 1.0;
    LOG(INFO) << "rnd = " << rnd << " i=" << i << " q=" << q;
    ASSERT_GE(q, 0)
      << " rnd=" << rnd << "  i=" << i << " prng_mod_power" << prng_mod_power;
  }
}